

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O1

void sysbvm_byteStream_nextPutStringWithSize
               (sysbvm_context_t *context,sysbvm_tuple_t byteStream,size_t stringSize,char *string)

{
  ulong requiredCapacity;
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  
  if (((stringSize != 0) && (byteStream != 0)) && ((byteStream & 0xf) == 0)) {
    uVar1 = *(ulong *)(byteStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar2 = (long)uVar1 >> 4;
    }
    else {
      lVar2 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(byteStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar1 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar1 = 0;
    }
    requiredCapacity = stringSize + lVar2;
    if (uVar1 < requiredCapacity) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,requiredCapacity);
    }
    memcpy((void *)(*(long *)(byteStream + 0x18) + lVar2 + 0x10),string,stringSize);
    if (requiredCapacity + 0x800000000000000 >> 0x3c == 0) {
      sVar3 = requiredCapacity * 0x10 | 0xb;
    }
    else {
      sVar3 = sysbvm_tuple_uint64_encodeBig(context,requiredCapacity);
    }
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar3;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPutStringWithSize(sysbvm_context_t *context, sysbvm_tuple_t byteStream, size_t stringSize, const char *string)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream) || stringSize == 0)
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + stringSize;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(storage->bytes + size, string, stringSize);
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + stringSize);
}